

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

Vec<Hpipe::BranchSet::Range> * __thiscall
Hpipe::Vec<Hpipe::BranchSet::Range>::without
          (Vec<Hpipe::BranchSet::Range> *__return_storage_ptr__,Vec<Hpipe::BranchSet::Range> *this,
          uint index)

{
  pointer pRVar1;
  uint uVar2;
  
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::reserve
            (&__return_storage_ptr__->
              super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>,
             ((long)(this->
                    super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
                    .
                    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->
                    super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
                    .
                    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
  uVar2 = 0;
  while( true ) {
    pRVar1 = (this->super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
             .super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->
                      super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                      ).
                      super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 5) <=
        (ulong)uVar2) break;
    if (index != uVar2) {
      std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>::
      emplace_back<Hpipe::BranchSet::Range_const&>
                ((vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>> *)
                 __return_storage_ptr__,pRVar1 + uVar2);
    }
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Vec      without              ( unsigned index             ) const { Vec res; res.reserve( this->size() - 1   ); for( unsigned i = 0  ; i < this->size(); ++i ) if ( i != index ) res << this->operator[]( i ); return res; }